

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

StringConst * __thiscall MixedArena::alloc<wasm::StringConst>(MixedArena *this)

{
  StringConst *pSVar1;
  
  pSVar1 = (StringConst *)allocSpace(this,0x20,8);
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)74>).super_Expression._id = StringConstId;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)74>).super_Expression.type.id = 0;
  (pSVar1->string).super_IString.str._M_len = 0;
  (pSVar1->string).super_IString.str._M_str = (char *)0x0;
  return pSVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }